

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void totalFinalize(sqlite3_context *context)

{
  double *pdVar1;
  double rVal;
  
  pdVar1 = (double *)sqlite3_aggregate_context(context,0);
  if (pdVar1 == (double *)0x0) {
    rVal = 0.0;
  }
  else if (*(char *)(pdVar1 + 4) == '\0') {
    rVal = (double)(long)pdVar1[2];
  }
  else {
    rVal = *pdVar1;
    if ((ulong)ABS(pdVar1[1]) < 0x7ff0000000000000) {
      rVal = rVal + pdVar1[1];
    }
  }
  sqlite3_result_double(context,rVal);
  return;
}

Assistant:

static void totalFinalize(sqlite3_context *context){
  SumCtx *p;
  double r = 0.0;
  p = sqlite3_aggregate_context(context, 0);
  if( p ){
    if( p->approx ){
      r = p->rSum;
      if( !sqlite3IsOverflow(p->rErr) ) r += p->rErr;
    }else{
      r = (double)(p->iSum);
    }
  }
  sqlite3_result_double(context, r);
}